

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynlink_impl_unix.c
# Opt level: O0

int dynlink_impl_interface_unload_unix(dynlink handle,dynlink_impl impl)

{
  int iVar1;
  undefined8 in_RSI;
  
  iVar1 = dlclose(in_RSI);
  return iVar1;
}

Assistant:

int dynlink_impl_interface_unload_unix(dynlink handle, dynlink_impl impl)
{
	(void)handle;

#if defined(__MEMORYCHECK__) || defined(__ADDRESS_SANITIZER__) || defined(__THREAD_SANITIZER__) || defined(__MEMORY_SANITIZER__)
	/* Disable dlclose when running with valgrind or sanitizers in order to maintain stacktraces */
	(void)impl;
	return 0;
#else
	return dlclose(impl);
#endif
}